

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O0

bool __thiscall lf::mesh::hybrid2d::Mesh::Contains(Mesh *this,Entity *e)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  bool local_79;
  bool local_61;
  bool local_49;
  Entity *e_local;
  Mesh *this_local;
  
  iVar2 = (**e->_vptr_Entity)();
  if (iVar2 == 0) {
    bVar1 = std::vector<lf::mesh::hybrid2d::Triangle,_std::allocator<lf::mesh::hybrid2d::Triangle>_>
            ::empty(&this->trias_);
    if (((!bVar1) &&
        (pvVar3 = std::
                  vector<lf::mesh::hybrid2d::Triangle,_std::allocator<lf::mesh::hybrid2d::Triangle>_>
                  ::front(&this->trias_), pvVar3 <= e)) &&
       (pvVar3 = std::
                 vector<lf::mesh::hybrid2d::Triangle,_std::allocator<lf::mesh::hybrid2d::Triangle>_>
                 ::back(&this->trias_), e <= pvVar3)) {
      return true;
    }
    bVar1 = std::
            vector<lf::mesh::hybrid2d::Quadrilateral,_std::allocator<lf::mesh::hybrid2d::Quadrilateral>_>
            ::empty(&this->quads_);
    local_49 = false;
    if (!bVar1) {
      pvVar4 = std::
               vector<lf::mesh::hybrid2d::Quadrilateral,_std::allocator<lf::mesh::hybrid2d::Quadrilateral>_>
               ::front(&this->quads_);
      local_49 = false;
      if (pvVar4 <= e) {
        pvVar4 = std::
                 vector<lf::mesh::hybrid2d::Quadrilateral,_std::allocator<lf::mesh::hybrid2d::Quadrilateral>_>
                 ::back(&this->quads_);
        local_49 = e <= pvVar4;
      }
    }
    return local_49;
  }
  if (iVar2 == 1) {
    pvVar5 = std::vector<lf::mesh::hybrid2d::Segment,_std::allocator<lf::mesh::hybrid2d::Segment>_>
             ::front(&this->segments_);
    local_61 = false;
    if (pvVar5 <= e) {
      pvVar5 = std::
               vector<lf::mesh::hybrid2d::Segment,_std::allocator<lf::mesh::hybrid2d::Segment>_>::
               back(&this->segments_);
      local_61 = e <= pvVar5;
    }
    return local_61;
  }
  if (iVar2 == 2) {
    pvVar6 = std::vector<lf::mesh::hybrid2d::Point,_std::allocator<lf::mesh::hybrid2d::Point>_>::
             front(&this->points_);
    local_79 = false;
    if (pvVar6 <= e) {
      pvVar6 = std::vector<lf::mesh::hybrid2d::Point,_std::allocator<lf::mesh::hybrid2d::Point>_>::
               back(&this->points_);
      local_79 = e <= pvVar6;
    }
    return local_79;
  }
  return false;
}

Assistant:

bool Mesh::Contains(const Entity &e) const {
  switch (e.Codim()) {
    case 0:
      return (!trias_.empty() && &e >= &trias_.front() &&
              &e <= &trias_.back()) ||
             (!quads_.empty() && &e >= &quads_.front() && &e <= &quads_.back());
    case 1:
      return &e >= &segments_.front() && &e <= &segments_.back();
    case 2:
      return &e >= &points_.front() && &e <= &points_.back();
    default:
      return false;
  }
}